

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O1

int ffgtvf(fitsfile *gfptr,long *firstfailed,int *status)

{
  int iVar1;
  char *__format;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  fitsfile *fptr;
  long nmembers;
  long ngroups;
  char errstr [71];
  fitsfile *local_90;
  long local_88;
  long local_80;
  char local_78 [72];
  
  local_88 = 0;
  local_80 = 0;
  local_90 = (fitsfile *)0x0;
  if (*status != 0) {
    return *status;
  }
  *firstfailed = 0;
  iVar1 = ffgtnm(gfptr,&local_88,status);
  *status = iVar1;
  if (local_88 < 1) {
    lVar4 = 1;
  }
  else {
    lVar2 = 1;
    do {
      lVar4 = lVar2;
      if (*status != 0) break;
      iVar1 = ffgmop(gfptr,lVar2,&local_90,status);
      *status = iVar1;
      ffclos(local_90,status);
      lVar4 = lVar2 + 1;
      bVar5 = lVar2 < local_88;
      lVar2 = lVar4;
    } while (bVar5);
  }
  if (*status == 0) {
    iVar1 = ffgmng(gfptr,&local_80,status);
    lVar2 = local_80;
    *status = iVar1;
    if (local_80 < 1) {
      lVar4 = 1;
    }
    else {
      lVar3 = 1;
      do {
        lVar4 = lVar3;
        if (*status != 0) break;
        iVar1 = ffgtop(gfptr,(int)lVar3,&local_90,status);
        *status = iVar1;
        ffclos(local_90,status);
        lVar4 = lVar3 + 1;
        bVar5 = lVar3 != lVar2;
        lVar3 = lVar4;
      } while (bVar5);
    }
    if (*status == 0) goto LAB_0018467d;
    *firstfailed = -lVar4;
    __format = "Group table verify failed for GRPID index %ld (ffgtvf)";
  }
  else {
    *firstfailed = lVar4;
    __format = "Group table verify failed for member %ld (ffgtvf)";
  }
  snprintf(local_78,0x47,__format,lVar4);
  ffpmsg(local_78);
LAB_0018467d:
  return *status;
}

Assistant:

int ffgtvf(fitsfile *gfptr,       /* FITS file pointer to group             */
	   long     *firstfailed, /* Member ID (if positive) of first failed
				     member HDU verify check or GRPID index
				     (if negitive) of first failed group
				     link verify check.                     */
	   int      *status)      /* return status code                     */

/*
 check the integrity of a grouping table to make sure that all group members 
 are accessible and all the links to other grouping tables are valid. The
 firstfailed parameter returns the member ID of the first member HDU to fail
 verification if positive or the first group link to fail if negative; 
 otherwise firstfailed contains a return value of 0.
*/

{
  long i;
  long nmembers = 0;
  long ngroups  = 0;

  char errstr[FLEN_VALUE];

  fitsfile *fptr = NULL;


  if(*status != 0) return(*status);

  *firstfailed = 0;

  do
    {
      /*
	attempt to open all the members of the grouping table. We stop
	at the first member which cannot be opened (which implies that it
	cannot be located)
      */

      *status = fits_get_num_members(gfptr,&nmembers,status);

      for(i = 1; i <= nmembers && *status == 0; ++i)
	{
	  *status = fits_open_member(gfptr,i,&fptr,status);
	  fits_close_file(fptr,status);
	}

      /*
	if the status is non-zero from the above loop then record the
	member index that caused the error
      */

      if(*status != 0)
	{
	  *firstfailed = i;
	  snprintf(errstr,FLEN_VALUE,"Group table verify failed for member %ld (ffgtvf)",
		  i);
	  ffpmsg(errstr);
	  continue;
	}

      /*
	attempt to open all the groups linked to this grouping table. We stop
	at the first group which cannot be opened (which implies that it
	cannot be located)
      */

      *status = fits_get_num_groups(gfptr,&ngroups,status);

      for(i = 1; i <= ngroups && *status == 0; ++i)
	{
	  *status = fits_open_group(gfptr,i,&fptr,status);
	  fits_close_file(fptr,status);
	}

      /*
	if the status from the above loop is non-zero, then record the
	GRPIDn index of the group that caused the failure
      */

      if(*status != 0)
	{
	  *firstfailed = -1*i;
	  snprintf(errstr,FLEN_VALUE,
		  "Group table verify failed for GRPID index %ld (ffgtvf)",i);
	  ffpmsg(errstr);
	  continue;
	}

    }while(0);

  return(*status);
}